

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::SharedLibraryShellCommand::configureInputs
          (SharedLibraryShellCommand *this,ConfigureContext *ctx,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value
          )

{
  pointer ppBVar1;
  BuildNode *pBVar2;
  BuildNode **input;
  pointer ppBVar3;
  StringRef local_60;
  string local_50;
  
  llbuild::buildsystem::ExternalCommand::configureInputs(&this->super_ExternalCommand,ctx,value);
  ppBVar1 = (this->super_ExternalCommand).super_Command.inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar3 = (this->super_ExternalCommand).super_Command.inputs.
                 super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar3 != ppBVar1;
      ppBVar3 = ppBVar3 + 1) {
    pBVar2 = *ppBVar3;
    if (pBVar2->type != Virtual) {
      local_60.Data = (pBVar2->super_Node).name._M_dataplus._M_p;
      local_60.Length = (pBVar2->super_Node).name._M_string_length;
      llvm::StringRef::str_abi_cxx11_(&local_50,&local_60);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->sharedLibInputs,&local_50);
      std::__cxx11::string::_M_dispose();
    }
  }
  if ((this->sharedLibInputs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->sharedLibInputs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    llvm::Twine::Twine((Twine *)&local_50,"SharedLibraryTool requires inputs to be specified");
    llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&local_50);
  }
  return;
}

Assistant:

virtual void configureInputs(const ConfigureContext& ctx,
                               const std::vector<Node*>& value) override {
    ExternalCommand::configureInputs(ctx, value);

    for (const auto& input : getInputs()) {
      if (!input->isVirtual()) {
        sharedLibInputs.push_back(input->getName());
      }
    }
    if (sharedLibInputs.empty()) {
      ctx.error("SharedLibraryTool requires inputs to be specified");
    }
  }